

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O1

void __thiscall ExprTest_SymbolicIfExpr_Test::TestBody(ExprTest_SymbolicIfExpr_Test *this)

{
  bool bVar1;
  ExprBase EVar2;
  ExprFactory *this_00;
  char *pcVar3;
  char *in_R9;
  StringRef value;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  Expr then_expr;
  LogicalConstant condition;
  Expr else_expr;
  AssertHelper local_80;
  AssertionResult local_78;
  string local_68;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> local_48;
  ExprBase local_40;
  AssertHelper local_38;
  BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> local_30;
  
  local_68._M_dataplus._M_p._0_1_ = 1;
  local_68._M_string_length = 0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_68._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  this_00 = &(this->super_ExprTest).factory_;
  local_40.impl_ =
       (Impl *)mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant(this_00,true);
  value.size_ = 1;
  value.data_ = "a";
  local_48.super_ExprBase.impl_ =
       (ExprBase)mp::BasicExprFactory<std::allocator<char>_>::MakeStringLiteral(this_00,value);
  local_30.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeReference(this_00,FIRST_REFERENCE,0);
  EVar2.impl_ = (Impl *)mp::BasicExprFactory<std::allocator<char>>::
                        MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>,(mp::expr::Kind)71>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>
                                  ((BasicExprFactory<std::allocator<char>> *)this_00,
                                   (LogicalExpr)local_40.impl_,local_48,
                                   (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>)
                                   local_30.super_ExprBase.impl_);
  local_78.success_ = (ExprBase)EVar2.impl_ != (ExprBase)0x0;
  local_78.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((ExprBase)EVar2.impl_ == (ExprBase)0x0) {
    testing::Message::Message((Message *)&local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)&local_78,(AssertionResult *)"e != 0","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x263
               ,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (local_80.data_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_80.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_80.data_ + 8))();
      }
      local_80.data_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_78.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78._0_4_ = 0x47;
  local_80.data_._0_4_ = (EVar2.impl_)->kind_;
  testing::internal::CmpHelperEQ<mp::expr::Kind,mp::expr::Kind>
            ((internal *)&local_68,"expr::IFSYM","e.kind()",(Kind *)&local_78,(Kind *)&local_80);
  if ((char)local_68._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_78);
    if ((undefined8 *)local_68._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_68._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x264
               ,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((Impl *)local_78._0_8_ != (Impl *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((Impl *)local_78._0_8_ != (Impl *)0x0)) {
        (**(code **)(*(long *)local_78._0_8_ + 8))();
      }
      local_78._0_8_ = (Impl *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_68._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78._0_8_ =
       mp::internal::ExprBase::Create<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
                 (*(Impl **)(EVar2.impl_ + 2));
  testing::internal::
  CmpHelperEQ<mp::LogicalConstant,mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>>
            ((internal *)&local_68,"condition","e.condition()",(LogicalConstant *)&local_40,
             (BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)&local_78);
  if ((char)local_68._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_78);
    if ((undefined8 *)local_68._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_68._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x265
               ,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((Impl *)local_78._0_8_ != (Impl *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((Impl *)local_78._0_8_ != (Impl *)0x0)) {
        (**(code **)(*(long *)local_78._0_8_ + 8))();
      }
      local_78._0_8_ = (Impl *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_68._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78._0_8_ =
       mp::internal::ExprBase::Create<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>
                 (*(Impl **)(EVar2.impl_ + 4));
  testing::internal::
  CmpHelperEQ<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>
            ((internal *)&local_68,"then_expr","e.then_expr()",&local_48,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)&local_78);
  if ((char)local_68._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_78);
    if ((undefined8 *)local_68._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_68._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x266
               ,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((Impl *)local_78._0_8_ != (Impl *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((Impl *)local_78._0_8_ != (Impl *)0x0)) {
        (**(code **)(*(long *)local_78._0_8_ + 8))();
      }
      local_78._0_8_ = (Impl *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_68._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_78._0_8_ =
       mp::internal::ExprBase::Create<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>
                 (*(Impl **)(EVar2.impl_ + 6));
  testing::internal::
  CmpHelperEQ<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>
            ((internal *)&local_68,"else_expr","e.else_expr()",
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)&local_30,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)&local_78);
  if ((char)local_68._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_78);
    if ((undefined8 *)local_68._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_68._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x267
               ,pcVar3);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((Impl *)local_78._0_8_ != (Impl *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((Impl *)local_78._0_8_ != (Impl *)0x0)) {
        (**(code **)(*(long *)local_78._0_8_ + 8))();
      }
      local_78._0_8_ = (Impl *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_68._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((internal)local_78.success_ == (internal)0x1) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"invalid argument","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicExprFactory<std::allocator<char>>::
      MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>,(mp::expr::Kind)71>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>
                ((BasicExprFactory<std::allocator<char>> *)this_00,(LogicalExpr)0x0,local_48,
                 (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>)local_30.super_ExprBase.impl_);
    }
    testing::AssertionResult::operator<<
              (&local_78,
               (char (*) [146])
               "Expected: factory_.MakeSymbolicIf(LogicalExpr(), then_expr, else_expr) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  testing::Message::Message((Message *)&local_68);
  if (local_78.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((local_78.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_80,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x26a,
             pcVar3);
  testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_68);
  testing::internal::AssertHelper::~AssertHelper(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0)) {
      (**(code **)(*(size_type *)local_68._M_dataplus._M_p + 8))();
    }
    local_68._M_dataplus._M_p = (pointer)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_78.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::AssertionSuccess();
  if ((internal)local_78.success_ == (internal)0x1) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"invalid argument","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicExprFactory<std::allocator<char>>::
      MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>,(mp::expr::Kind)71>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>
                ((BasicExprFactory<std::allocator<char>> *)this_00,(LogicalExpr)local_40.impl_,
                 (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>)0x0,
                 (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>)local_30.super_ExprBase.impl_);
    }
    testing::AssertionResult::operator<<
              (&local_78,
               (char (*) [139])
               "Expected: factory_.MakeSymbolicIf(condition, Expr(), else_expr) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  testing::Message::Message((Message *)&local_68);
  if (local_78.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((local_78.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_80,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x26c,
             pcVar3);
  testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_68);
  testing::internal::AssertHelper::~AssertHelper(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0)) {
      (**(code **)(*(size_type *)local_68._M_dataplus._M_p + 8))();
    }
    local_68._M_dataplus._M_p = (pointer)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_78.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  mp::BasicExprFactory<std::allocator<char>>::
  MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>,(mp::expr::Kind)71>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>
            ((BasicExprFactory<std::allocator<char>> *)this_00,(LogicalExpr)local_40.impl_,local_48,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>)0x0);
  return;
}

Assistant:

TEST_F(ExprTest, SymbolicIfExpr) {
  mp::SymbolicIfExpr e;
  EXPECT_TRUE(e == 0);
  (void)Expr(e);
  auto condition = factory_.MakeLogicalConstant(true);
  Expr then_expr = factory_.MakeStringLiteral("a");
  Expr else_expr = factory_.MakeVariable(0);
  e = factory_.MakeSymbolicIf(condition, then_expr, else_expr);
  EXPECT_TRUE(e != 0);
  EXPECT_EQ(expr::IFSYM, e.kind());
  EXPECT_EQ(condition, e.condition());
  EXPECT_EQ(then_expr, e.then_expr());
  EXPECT_EQ(else_expr, e.else_expr());
  EXPECT_ASSERT(factory_.MakeSymbolicIf(LogicalExpr(),
                                        then_expr, else_expr),
                "invalid argument");
  EXPECT_ASSERT(factory_.MakeSymbolicIf(condition, Expr(), else_expr),
                "invalid argument");
  factory_.MakeSymbolicIf(condition, then_expr, Expr());
}